

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpOps.cpp
# Opt level: O3

sz_ssize_t sznet::net::sockets::sz_udp_recv(sz_sock sock,void *buf,int size,sockaddr *addr)

{
  ssize_t sVar1;
  socklen_t local_c [2];
  socklen_t lenAddr;
  
  local_c[0] = 0x10;
  sVar1 = recvfrom(sock,buf,(long)size,0,(sockaddr *)addr,local_c);
  return sVar1;
}

Assistant:

sz_ssize_t sz_udp_recv(sz_sock sock, void* buf, int size, struct sockaddr* addr)
{
#if defined(SZ_OS_LINUX)
	void* recvBuf = buf;
	size_t recvBufSize = implicit_cast<size_t>(size);
	socklen_t lenAddr = sizeof(*addr);
#else
	char* recvBuf = reinterpret_cast<char*>(buf);
	int recvBufSize = size;
	int lenAddr = sizeof(*addr);
#endif

	return ::recvfrom(sock, recvBuf, recvBufSize, 0, addr, &lenAddr);
}